

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::InfogainLossParameter::InternalSerializeWithCachedSizesToArray
          (InfogainLossParameter *this,bool deterministic,uint8 *target)

{
  string *psVar1;
  void *pvVar2;
  uint8 *puVar3;
  
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    psVar1 = (this->source_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,SERIALIZE,
               "caffe.InfogainLossParameter.source");
    psVar1 = (this->source_).ptr_;
    *target = '\n';
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar1,target + 1);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
  return puVar3;
}

Assistant:

::google::protobuf::uint8* InfogainLossParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.InfogainLossParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.InfogainLossParameter.source");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->source(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.InfogainLossParameter)
  return target;
}